

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v2mplayer.cpp
# Opt level: O2

void __thiscall V2MPlayer::Play(V2MPlayer *this,uint32_t a_time)

{
  uint32_t *smpldelta;
  uint uVar1;
  uint uVar2;
  anon_enum_32 aVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  
  if (((this->m_base).valid == true) && (this->m_samplerate != 0)) {
    (this->m_state).state = OFF;
    Reset(this);
    (this->m_base).valid = false;
    uVar1 = this->m_samplerate;
    uVar2 = this->m_tpc;
    uVar5 = 0;
    (this->m_state).state = PLAYING;
    smpldelta = &(this->m_state).smpldelta;
    (this->m_state).smpldelta = 0;
    (this->m_state).smplrem = 0;
    aVar3 = PLAYING;
    uVar4 = 0;
    while( true ) {
      uVar6 = uVar5 + uVar4;
      uVar7 = (uint)(((ulong)uVar1 * (ulong)a_time) / (ulong)uVar2);
      if ((uVar7 <= uVar6) || (aVar3 != PLAYING)) break;
      Tick(this);
      aVar3 = (this->m_state).state;
      uVar4 = uVar6;
      if (aVar3 == PLAYING) {
        (this->m_state).smpldelta = 0;
        anon_unknown.dwarf_22f9::UpdateSampleDelta
                  ((this->m_state).nexttime,(this->m_state).time,(this->m_state).usecs,
                   (this->m_base).timediv2,&(this->m_state).smplrem,smpldelta);
        uVar5 = (this->m_state).smpldelta;
        aVar3 = (this->m_state).state;
      }
      else {
        *smpldelta = 0xffffffff;
        uVar5 = 0xffffffff;
      }
    }
    (this->m_state).cursmpl = uVar4;
    (this->m_state).smpldelta = (uVar4 - uVar7) + uVar5;
    this->m_fadeval = 1.0;
    this->m_fadedelta = 0.0;
    (this->m_base).valid = true;
  }
  return;
}

Assistant:

void V2MPlayer::Play(uint32_t a_time)
{
    if (!m_base.valid || !m_samplerate)
        return;

    Stop();
    Reset();

    m_base.valid = sFALSE;
    uint32_t destsmpl, cursmpl = 0;
    {
        destsmpl = ((uint64_t)a_time * m_samplerate) / m_tpc;
    }

    m_state.state = PlayerState::PLAYING;
    m_state.smpldelta = 0;
    m_state.smplrem = 0;
    while ((cursmpl + m_state.smpldelta) < destsmpl && m_state.state == PlayerState::PLAYING)
    {
        cursmpl += m_state.smpldelta;
        Tick();
        if (m_state.state == PlayerState::PLAYING) {
            m_state.smpldelta = 0;
            UpdateSampleDelta(m_state.nexttime, m_state.time, m_state.usecs, m_base.timediv2, &m_state.smplrem, &m_state.smpldelta);
        } else
            m_state.smpldelta = -1;
    }

    m_state.cursmpl    = cursmpl;
    m_state.smpldelta -= (destsmpl - cursmpl);
    m_fadeval    = 1.0f;
    m_fadedelta  = 0.0f;
    m_base.valid = sTRUE;
}